

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

reverse_iterator * __thiscall
llvm::sys::path::rbegin
          (reverse_iterator *__return_storage_ptr__,path *this,StringRef Path,Style style)

{
  reverse_iterator local_48;
  
  local_48.Path.Length = (size_t)Path.Data;
  local_48.Component.Data = (char *)0x0;
  local_48.Component.Length = 0;
  local_48.S = (Style)Path.Length;
  local_48.Path.Data = (char *)this;
  local_48.Position = local_48.Path.Length;
  reverse_iterator::operator++(&local_48);
  (__return_storage_ptr__->Path).Data = local_48.Path.Data;
  (__return_storage_ptr__->Path).Length = local_48.Path.Length;
  (__return_storage_ptr__->Component).Data = local_48.Component.Data;
  (__return_storage_ptr__->Component).Length = local_48.Component.Length;
  __return_storage_ptr__->Position = local_48.Position;
  *(ulong *)&__return_storage_ptr__->S = CONCAT44(local_48._44_4_,local_48.S);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rbegin(StringRef Path, Style style) {
  reverse_iterator I;
  I.Path = Path;
  I.Position = Path.size();
  I.S = style;
  return ++I;
}